

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proof.cc
# Opt level: O0

void __thiscall gss::innards::Proof::create_clique_nonedge(Proof *this,int v,int w)

{
  type pbVar1;
  ostream *poVar2;
  mapped_type *pmVar3;
  ostream *poVar4;
  pointer pIVar5;
  int in_EDX;
  int in_ESI;
  map<std::pair<long,_long>,_long,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<const_std::pair<long,_long>,_long>_>_>
  *in_RDI;
  unique_ptr<std::basic_ostream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
  *in_stack_ffffffffffffff90;
  pair<int,_int> *__args;
  pair<int,_int> local_40;
  key_type_conflict *in_stack_ffffffffffffffc8;
  undefined1 in_stack_ffffffffffffffd0;
  undefined7 in_stack_ffffffffffffffd1;
  pair<int,_int> local_28;
  long local_20;
  long local_18;
  int local_10;
  int local_c [3];
  
  local_10 = in_EDX;
  local_c[0] = in_ESI;
  std::unique_ptr<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>::
  operator->((unique_ptr<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_> *
             )0x152990);
  pbVar1 = std::
           unique_ptr<std::basic_ostream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
           ::operator*(in_stack_ffffffffffffff90);
  poVar2 = std::operator<<(pbVar1,"u 1 ~x");
  std::unique_ptr<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>::
  operator->((unique_ptr<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_> *
             )0x1529bc);
  local_18 = (long)local_c[0];
  pmVar3 = std::
           map<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<long>,_std::allocator<std::pair<const_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<long>,_std::allocator<std::pair<const_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)CONCAT71(in_stack_ffffffffffffffd1,in_stack_ffffffffffffffd0),
                        in_stack_ffffffffffffffc8);
  poVar2 = std::operator<<(poVar2,(string *)pmVar3);
  poVar2 = std::operator<<(poVar2," 1 ~x");
  std::unique_ptr<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>::
  operator->((unique_ptr<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_> *
             )0x152a04);
  local_20 = (long)local_10;
  pmVar3 = std::
           map<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<long>,_std::allocator<std::pair<const_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<long>,_std::allocator<std::pair<const_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)CONCAT71(in_stack_ffffffffffffffd1,in_stack_ffffffffffffffd0),
                        in_stack_ffffffffffffffc8);
  poVar4 = std::operator<<(poVar2,(string *)pmVar3);
  std::operator<<(poVar4," >= 1 ;\n");
  pIVar5 = std::unique_ptr<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
           ::operator->((unique_ptr<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                         *)0x152a48);
  pIVar5->proof_line = pIVar5->proof_line + 1;
  pIVar5 = std::unique_ptr<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
           ::operator->((unique_ptr<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                         *)0x152a64);
  __args = (pair<int,_int> *)&pIVar5->non_edge_constraints;
  std::pair<int,_int>::pair<int_&,_int_&,_true>(&local_28,local_c,&local_10);
  std::unique_ptr<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>::
  operator->((unique_ptr<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_> *
             )0x152a8d);
  std::
  map<std::pair<long,long>,long,std::less<std::pair<long,long>>,std::allocator<std::pair<std::pair<long,long>const,long>>>
  ::emplace<std::pair<int,int>,long&>(in_RDI,__args,(long *)poVar2);
  std::unique_ptr<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>::
  operator->((unique_ptr<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_> *
             )0x152ab9);
  std::pair<int,_int>::pair<int_&,_int_&,_true>(&local_40,&local_10,local_c);
  std::unique_ptr<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>::
  operator->((unique_ptr<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_> *
             )0x152ae2);
  std::
  map<std::pair<long,long>,long,std::less<std::pair<long,long>>,std::allocator<std::pair<std::pair<long,long>const,long>>>
  ::emplace<std::pair<int,int>,long&>(in_RDI,__args,(long *)poVar2);
  return;
}

Assistant:

auto Proof::create_clique_nonedge(int v, int w) -> void
{
    *_imp->proof_stream << "u 1 ~x" << _imp->binary_variable_mappings[v]
                        << " 1 ~x" << _imp->binary_variable_mappings[w] << " >= 1 ;\n";
    ++_imp->proof_line;
    _imp->non_edge_constraints.emplace(pair{v, w}, _imp->proof_line);
    _imp->non_edge_constraints.emplace(pair{w, v}, _imp->proof_line);
}